

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O2

void __thiscall
ncnn::Pooling1D::make_padding
          (Pooling1D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float v;
  Option opt_b;
  Option local_68;
  
  iVar3 = bottom_blob->w;
  Mat::operator=(bottom_blob_bordered,bottom_blob);
  v = 0.0;
  if (this->pooling_type == 0) {
    v = *(float *)(&DAT_002dc21c + (ulong)(bottom_blob->elemsize == 1) * 4);
  }
  switch(this->pad_mode) {
  case 0:
    uVar2 = this->pad_left;
    iVar1 = (int)((iVar3 + uVar2 + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar3 = this->stride_w - iVar1;
    if (iVar1 == 0) {
      iVar3 = 0;
    }
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.use_reserved_3 = opt->use_reserved_3;
    local_68.use_reserved_4 = opt->use_reserved_4;
    local_68.use_reserved_5 = opt->use_reserved_5;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar4 = iVar3 + this->pad_right;
    break;
  case 1:
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.use_reserved_3 = opt->use_reserved_3;
    local_68.use_reserved_4 = opt->use_reserved_4;
    local_68.use_reserved_5 = opt->use_reserved_5;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar2 = this->pad_left;
    uVar4 = this->pad_right;
    break;
  case 2:
    uVar4 = ~((iVar3 + -1) % this->stride_w) + this->kernel_w;
    if ((int)uVar4 < 1) {
      return;
    }
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.use_reserved_3 = opt->use_reserved_3;
    local_68.use_reserved_4 = opt->use_reserved_4;
    local_68.use_reserved_5 = opt->use_reserved_5;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar2 = uVar4 >> 1;
    uVar4 = uVar4 - uVar2;
    break;
  case 3:
    uVar2 = ~((iVar3 + -1) % this->stride_w) + this->kernel_w;
    if ((int)uVar2 < 1) {
      return;
    }
    local_68.lightmode = opt->lightmode;
    local_68._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_68.num_threads = opt->num_threads;
    local_68.workspace_allocator = opt->workspace_allocator;
    local_68.openmp_blocktime = opt->openmp_blocktime;
    local_68.use_winograd_convolution = opt->use_winograd_convolution;
    local_68.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_68.use_int8_inference = opt->use_int8_inference;
    local_68.use_vulkan_compute = opt->use_vulkan_compute;
    local_68.use_bf16_storage = opt->use_bf16_storage;
    local_68.use_fp16_packed = opt->use_fp16_packed;
    local_68.use_fp16_storage = opt->use_fp16_storage;
    local_68.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_68.use_int8_packed = opt->use_int8_packed;
    local_68.use_int8_storage = opt->use_int8_storage;
    local_68.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_68.use_packing_layout = opt->use_packing_layout;
    local_68.use_shader_pack8 = opt->use_shader_pack8;
    local_68.use_subgroup_basic = opt->use_subgroup_basic;
    local_68.use_subgroup_vote = opt->use_subgroup_vote;
    local_68.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_68.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_68.use_image_storage = opt->use_image_storage;
    local_68.use_tensor_storage = opt->use_tensor_storage;
    local_68.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_68.flush_denormals = opt->flush_denormals;
    local_68.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_68.use_reserved_1 = opt->use_reserved_1;
    local_68.use_reserved_2 = opt->use_reserved_2;
    local_68.use_reserved_3 = opt->use_reserved_3;
    local_68.use_reserved_4 = opt->use_reserved_4;
    local_68.use_reserved_5 = opt->use_reserved_5;
    local_68.use_reserved_6 = opt->use_reserved_6;
    local_68.use_reserved_7 = opt->use_reserved_7;
    local_68.use_reserved_8 = opt->use_reserved_8;
    local_68.use_reserved_9 = opt->use_reserved_9;
    local_68.use_reserved_10 = opt->use_reserved_10;
    local_68.use_reserved_11 = opt->use_reserved_11;
    local_68.blob_allocator = opt->workspace_allocator;
    uVar4 = uVar2 >> 1;
    uVar2 = uVar2 - uVar4;
    break;
  default:
    goto switchD_002d40f1_default;
  }
  copy_make_border(bottom_blob,bottom_blob_bordered,0,0,uVar2,uVar4,0,v,&local_68);
switchD_002d40f1_default:
  return;
}

Assistant:

void Pooling1D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;

        if (wtail != 0)
            wtailpad = stride_w - wtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        if (wpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}